

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O2

Rectangle deqp::gls::LifetimeTests::details::randomViewport
                    (RenderContext *ctx,GLint maxWidth,GLint maxHeight,Random *rnd)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  Rectangle RVar4;
  
  uVar3 = (ulong)(uint)maxWidth;
  iVar2 = (*ctx->_vptr_RenderContext[4])();
  uVar1 = *(uint *)CONCAT44(extraout_var,iVar2);
  if ((int)uVar1 < maxWidth) {
    uVar3 = (ulong)uVar1;
  }
  RVar4.x = de::Random::getInt(rnd,0,uVar1 - (int)uVar3);
  uVar1 = ((uint *)CONCAT44(extraout_var,iVar2))[1];
  if ((int)uVar1 < maxHeight) {
    maxHeight = uVar1;
  }
  iVar2 = de::Random::getInt(rnd,0,uVar1 - maxHeight);
  RVar4.y = iVar2;
  uVar3 = uVar3 | (ulong)(uint)maxHeight << 0x20;
  RVar4.width = (int)uVar3;
  RVar4.height = (int)(uVar3 >> 0x20);
  return RVar4;
}

Assistant:

Rectangle randomViewport (const RenderContext& ctx, GLint maxWidth, GLint maxHeight,
						  Random& rnd)
{
	const RenderTarget&	target	= ctx.getRenderTarget();
	const GLint			width	= de::min(target.getWidth(), maxWidth);
	const GLint			xOff	= rnd.getInt(0, target.getWidth() - width);
	const GLint			height	= de::min(target.getHeight(), maxHeight);
	const GLint			yOff	= rnd.getInt(0, target.getHeight() - height);

	return Rectangle(xOff, yOff, width, height);
}